

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
     ::clear_and_delete(btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                        *node,allocator_type *alloc)

{
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *pbVar1;
  field_type fVar2;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *pbVar3;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  bVar4;
  allocator_type *in_RCX;
  allocator_type *alloc_00;
  allocator_type *alloc_01;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *this;
  ulong uVar5;
  
  if (((ulong)node & 7) == 0) {
    if (node[0xb] !=
        (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
         )0x0) {
      start(node);
      fVar2 = count(node);
      value_destroy_n(node,'\0',fVar2,in_RCX);
      bVar4 = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
               )0x6;
      if (node[0xb] !=
          (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
           )0x0) {
        bVar4 = node[0xb];
      }
      deallocate((ulong)(((uint)(byte)bVar4 + (uint)(byte)bVar4 * 4) * 8 + 0x10),node,alloc_00);
      return;
    }
    fVar2 = count(node);
    if (fVar2 == '\0') {
      operator_delete(node,0x138);
      return;
    }
    pbVar1 = *(btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
               **)node;
    do {
      if (node[0xb] !=
          (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
           )0x0) {
        this = *(btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                 **)node;
        if (((ulong)this & 7) == 0) {
          uVar5 = (ulong)(byte)node[8];
          if ((byte)this[10] < (byte)node[8]) {
            __assert_fail("pos <= parent->finish()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                          ,0x7ef,
                          "static void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>>::clear_and_delete(btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>]"
                         );
          }
          goto LAB_00fc3292;
        }
        break;
      }
      start(node);
      node = child(node,'\0');
    } while (((ulong)node & 7) == 0);
  }
LAB_00fc3257:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_stri..." /* TRUNCATED STRING LITERAL */
               );
LAB_00fc3292:
  pbVar3 = child(this,(field_type)uVar5);
  if (((ulong)pbVar3 & 7) != 0) goto LAB_00fc3257;
  if (pbVar3[0xb] ==
      (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
       )0x0) {
    while (pbVar3[0xb] ==
           (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
            )0x0) {
      start(pbVar3);
      pbVar3 = child(pbVar3,'\0');
      if (((ulong)pbVar3 & 7) != 0) goto LAB_00fc3257;
    }
    uVar5 = (ulong)(byte)pbVar3[8];
    this = *(btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
             **)pbVar3;
  }
  start(pbVar3);
  fVar2 = count(pbVar3);
  value_destroy_n(pbVar3,'\0',fVar2,in_RCX);
  bVar4 = pbVar3[0xb];
  if (pbVar3[0xb] ==
      (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
       )0x0) {
    bVar4 = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
             )0x6;
  }
  deallocate((ulong)(((uint)(byte)bVar4 + (uint)(byte)bVar4 * 4) * 8 + 0x10),pbVar3,alloc_01);
  if (((ulong)this & 7) != 0) goto LAB_00fc3257;
  pbVar3 = this;
  if ((byte)this[10] <= uVar5) {
    do {
      if (((ulong)pbVar3 & 7) != 0) goto LAB_00fc3257;
      bVar4 = pbVar3[8];
      uVar5 = (ulong)(byte)bVar4;
      this = *(btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
               **)pbVar3;
      start(pbVar3);
      fVar2 = count(pbVar3);
      value_destroy_n(pbVar3,'\0',fVar2,in_RCX);
      operator_delete(pbVar3,0x138);
      if (this == pbVar1) {
        return;
      }
      if (((ulong)this & 7) != 0) goto LAB_00fc3257;
      pbVar3 = this;
    } while ((byte)this[10] <= (byte)bVar4);
  }
  uVar5 = uVar5 + 1;
  goto LAB_00fc3292;
}

Assistant:

void btree_node<P>::clear_and_delete(btree_node *node, allocator_type *alloc) {
  if (node->is_leaf()) {
    node->value_destroy_n(node->start(), node->count(), alloc);
    deallocate(LeafSize(node->max_count()), node, alloc);
    return;
  }
  if (node->count() == 0) {
    deallocate(InternalSize(), node, alloc);
    return;
  }

  // The parent of the root of the subtree we are deleting.
  btree_node *delete_root_parent = node->parent();

  // Navigate to the leftmost leaf under node, and then delete upwards.
  while (node->is_internal()) node = node->start_child();
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
  // When generations are enabled, we delete the leftmost leaf last in case it's
  // the parent of the root and we need to check whether it's a leaf before we
  // can update the root's generation.
  // TODO(ezb): if we change btree_node::is_root to check a bool inside the node
  // instead of checking whether the parent is a leaf, we can remove this logic.
  btree_node *leftmost_leaf = node;
#endif
  // Use `size_type` because `pos` needs to be able to hold `kNodeSlots+1`,
  // which isn't guaranteed to be a valid `field_type`.
  size_type pos = node->position();
  btree_node *parent = node->parent();
  for (;;) {
    // In each iteration of the next loop, we delete one leaf node and go right.
    assert(pos <= parent->finish());
    do {
      node = parent->child(static_cast<field_type>(pos));
      if (node->is_internal()) {
        // Navigate to the leftmost leaf under node.
        while (node->is_internal()) node = node->start_child();
        pos = node->position();
        parent = node->parent();
      }
      node->value_destroy_n(node->start(), node->count(), alloc);
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
      if (leftmost_leaf != node)
#endif
        deallocate(LeafSize(node->max_count()), node, alloc);
      ++pos;
    } while (pos <= parent->finish());

    // Once we've deleted all children of parent, delete parent and go up/right.
    assert(pos > parent->finish());
    do {
      node = parent;
      pos = node->position();
      parent = node->parent();
      node->value_destroy_n(node->start(), node->count(), alloc);
      deallocate(InternalSize(), node, alloc);
      if (parent == delete_root_parent) {
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
        deallocate(LeafSize(leftmost_leaf->max_count()), leftmost_leaf, alloc);
#endif
        return;
      }
      ++pos;
    } while (pos > parent->finish());
  }
}